

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonvalue.cpp
# Opt level: O0

qint64 __thiscall QJsonValue::toInteger(QJsonValue *this,qint64 defaultValue)

{
  enable_if_t<std::is_integral_v<long_long>,_bool> eVar1;
  Type TVar2;
  undefined1 *in_RSI;
  QCborValue *in_RDI;
  long in_FS_OFFSET;
  double v;
  qint64 dblInt;
  double in_stack_ffffffffffffffb8;
  QJsonValue *in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffd0;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  TVar2 = ::QCborValue::type(in_RDI);
  if (TVar2 == Integer) {
    local_18 = (undefined1 *)
               ::QCborValue::toInteger
                         ((QCborValue *)(ulong)in_stack_ffffffffffffffd0,(qint64)in_RDI);
  }
  else {
    local_18 = in_RSI;
    if (TVar2 == Double) {
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      v = toDouble(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      eVar1 = anon_unknown.dwarf_995023::convertDoubleTo<long_long>(v,(longlong *)&local_10,true);
      if (eVar1) {
        local_18 = local_10;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (qint64)local_18;
}

Assistant:

qint64 QJsonValue::toInteger(qint64 defaultValue) const
{
    switch (value.type()) {
    case QCborValue::Integer:
        return value.toInteger();
    case QCborValue::Double: {
        qint64 dblInt;
        if (convertDoubleTo<qint64>(toDouble(), &dblInt))
            return dblInt;
        break;
    }
    default:
        break;
    }
    return defaultValue;
}